

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceWiseLinearCalib.cpp
# Opt level: O2

float __thiscall tactile::PieceWiseLinearCalib::map(PieceWiseLinearCalib *this,float x)

{
  const_iterator cVar1;
  long lVar2;
  _Base_ptr p_Var3;
  _Rb_tree_const_iterator<std::pair<const_float,_float>_> __tmp;
  _Rb_tree_header *p_Var4;
  float x_local;
  
  x_local = x;
  if ((this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count < 2) {
    __assert_fail("values.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ubi-agni[P]tactile_filters/PieceWiseLinearCalib.cpp"
                  ,0x30,"virtual float tactile::PieceWiseLinearCalib::map(float) const");
  }
  cVar1 = std::
          _Rb_tree<float,_std::pair<const_float,_float>,_std::_Select1st<std::pair<const_float,_float>_>,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>
          ::upper_bound(&(this->values)._M_t,&x_local);
  p_Var3 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (cVar1._M_node != p_Var3) {
    p_Var4 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar1._M_node != p_Var4) {
      lVar2 = std::_Rb_tree_decrement(cVar1._M_node);
      return (*(float *)&cVar1._M_node[1].field_0x4 - *(float *)(lVar2 + 0x24)) *
             ((x_local - *(float *)(lVar2 + 0x20)) /
             ((float)cVar1._M_node[1]._M_color - *(float *)(lVar2 + 0x20))) +
             *(float *)(lVar2 + 0x24);
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var4->_M_header);
  }
  return *(float *)&p_Var3[1].field_0x4;
}

Assistant:

float PieceWiseLinearCalib::map(float x) const
{
	assert(values.size() > 1);
	// retrieve first key that is larger than x
	CalibrationMap::const_iterator next = values.upper_bound(x);
	// if x is smaller than key range, clip to smallest value
	if (next == values.begin()) return values.begin()->second;
	// if x is larger than key range, clip to largest value
	if (next == values.end()) return values.rbegin()->second;
	CalibrationMap::const_iterator prev = next;
	--prev;
	return prev->second +
	       (x - prev->first) / (next->first - prev->first) * (next->second - prev->second);
}